

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O1

bool __thiscall
cbtCollisionWorldImporter::convertAllObjects
          (cbtCollisionWorldImporter *this,cbtBulletSerializedArrays *arrays)

{
  char *pcVar1;
  double dVar2;
  anon_union_8_2_511b660c_for_cbtHashPtr_0 aVar3;
  cbtCollisionShape **ppcVar4;
  cbtHashMap<cbtHashPtr,_cbtCollisionShape_*> *this_00;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  anon_union_8_2_511b660c_for_cbtHashPtr_0 aVar6;
  char *pcVar7;
  anon_union_8_2_511b660c_for_cbtHashPtr_0 *paVar8;
  long lVar9;
  int i_1;
  long lVar10;
  long lVar11;
  cbtCollisionShape *shape;
  char *newname;
  cbtOptimizedBvh *bvh;
  anon_union_8_2_511b660c_for_cbtHashPtr_0 local_a0;
  anon_union_8_2_511b660c_for_cbtHashPtr_0 local_98;
  cbtHashMap<cbtHashPtr,_cbtCollisionObject_*> *local_90;
  anon_union_8_2_511b660c_for_cbtHashPtr_0 local_88 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78 [2];
  float afStack_58 [4];
  cbtHashMap<cbtHashPtr,_cbtCollisionShape_*> *local_48;
  cbtHashMap<cbtHashString,_cbtCollisionShape_*> *local_40;
  cbtHashMap<cbtHashPtr,_const_char_*> *local_38;
  
  local_48 = &this->m_shapeMap;
  cbtHashMap<cbtHashPtr,_cbtCollisionShape_*>::clear(local_48);
  local_90 = &this->m_bodyMap;
  cbtHashMap<cbtHashPtr,_cbtCollisionObject_*>::clear(local_90);
  if (0 < *(int *)(arrays + 4)) {
    lVar11 = 0;
    do {
      local_88[0]._0_4_ = (*this->_vptr_cbtCollisionWorldImporter[0x1a])(this);
      local_88[0].m_hashValues[1] = extraout_var;
      (**(code **)(*local_88[0].m_pointer + 0x30))
                (local_88[0].m_pointer,*(undefined8 *)(*(long *)(arrays + 0x10) + lVar11 * 8));
      local_a0 = *(anon_union_8_2_511b660c_for_cbtHashPtr_0 *)
                  (*(long *)(arrays + 0x10) + lVar11 * 8);
      cbtHashMap<cbtHashPtr,_cbtOptimizedBvh_*>::insert
                (&this->m_bvhMap,(cbtHashPtr *)&local_a0,(cbtOptimizedBvh **)&local_88[0].m_pointer)
      ;
      lVar11 = lVar11 + 1;
    } while (lVar11 < *(int *)(arrays + 4));
  }
  if (0 < *(int *)(arrays + 0x24)) {
    lVar11 = 0;
    do {
      local_88[0]._0_4_ = (*this->_vptr_cbtCollisionWorldImporter[0x1a])(this);
      local_88[0].m_hashValues[1] = extraout_var_00;
      (**(code **)(*local_88[0].m_pointer + 0x28))
                (local_88[0].m_pointer,*(undefined8 *)(*(long *)(arrays + 0x30) + lVar11 * 8));
      local_a0 = *(anon_union_8_2_511b660c_for_cbtHashPtr_0 *)
                  (*(long *)(arrays + 0x30) + lVar11 * 8);
      cbtHashMap<cbtHashPtr,_cbtOptimizedBvh_*>::insert
                (&this->m_bvhMap,(cbtHashPtr *)&local_a0,(cbtOptimizedBvh **)&local_88[0].m_pointer)
      ;
      lVar11 = lVar11 + 1;
    } while (lVar11 < *(int *)(arrays + 0x24));
  }
  this_00 = local_48;
  if (0 < *(int *)(arrays + 0x44)) {
    local_38 = &this->m_objectNameMap;
    local_40 = &this->m_nameShapeMap;
    lVar11 = 0;
    do {
      aVar3 = (anon_union_8_2_511b660c_for_cbtHashPtr_0)
              ((anon_union_8_2_511b660c_for_cbtHashPtr_0 *)(*(long *)(arrays + 0x50) + lVar11 * 8))
              ->m_pointer;
      local_a0.m_pointer = convertCollisionShape(this,(cbtCollisionShapeData *)aVar3.m_pointer);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.m_pointer !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        local_88[0] = aVar3;
        cbtHashMap<cbtHashPtr,_cbtCollisionShape_*>::insert
                  (this_00,(cbtHashPtr *)local_88,(cbtCollisionShape **)&local_a0.m_pointer);
      }
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_a0.m_pointer !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0) && (*aVar3.m_pointer != 0)) {
        local_98.m_pointer = duplicateName(this,*aVar3.m_pointer);
        local_88[0].m_pointer = local_a0.m_pointer;
        cbtHashMap<cbtHashPtr,_const_char_*>::insert
                  (local_38,(cbtHashPtr *)local_88,(char **)&local_98.m_pointer);
        cbtHashString::cbtHashString((cbtHashString *)local_88,(char *)local_98.m_pointer);
        cbtHashMap<cbtHashString,_cbtCollisionShape_*>::insert
                  (local_40,(cbtHashString *)local_88,(cbtCollisionShape **)&local_a0.m_pointer);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88[0].m_pointer != local_78) {
          operator_delete(local_88[0].m_pointer,local_78[0]._M_allocated_capacity + 1);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < *(int *)(arrays + 0x44));
  }
  if (0 < *(int *)(arrays + 0xe4)) {
    lVar11 = 0;
    do {
      aVar3 = (anon_union_8_2_511b660c_for_cbtHashPtr_0)
              ((anon_union_8_2_511b660c_for_cbtHashPtr_0 *)(*(long *)(arrays + 0xf0) + lVar11 * 8))
              ->m_pointer;
      local_88[0] = *(anon_union_8_2_511b660c_for_cbtHashPtr_0 *)((long)aVar3.m_pointer + 8);
      iVar5 = cbtHashMap<cbtHashPtr,_cbtCollisionShape_*>::findIndex(this_00,(cbtHashPtr *)local_88)
      ;
      ppcVar4 = (this->m_shapeMap).m_valueArray.m_data;
      if ((ppcVar4 == (cbtCollisionShape **)0x0 || iVar5 == -1) ||
         (ppcVar4[iVar5] == (cbtCollisionShape *)0x0)) {
        puts("error: no shape found");
      }
      else {
        pcVar7 = (char *)((long)aVar3.m_pointer + 0x98);
        pcVar7[0] = '\0';
        pcVar7[1] = '\0';
        pcVar7[2] = '\0';
        pcVar7[3] = '\0';
        pcVar7[4] = '\0';
        pcVar7[5] = '\0';
        pcVar7[6] = '\0';
        pcVar7[7] = '\0';
        lVar9 = 0;
        paVar8 = local_88;
        aVar6 = aVar3;
        do {
          aVar6.m_pointer = aVar6.m_pointer + 0x20;
          lVar10 = 0;
          do {
            *(float *)((long)paVar8 + lVar10 * 4) =
                 (float)*(double *)((long)aVar6.m_pointer + lVar10 * 8);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          lVar9 = lVar9 + 1;
          paVar8 = paVar8 + 2;
        } while (lVar9 != 3);
        lVar9 = 0x10;
        do {
          *(float *)((long)&local_98 + lVar9 * 4) =
               (float)*(double *)((long)aVar3.m_pointer + lVar9 * 8);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x14);
        local_a0._0_4_ =
             (*this->_vptr_cbtCollisionWorldImporter[3])
                       (this,local_88,ppcVar4[iVar5],*(undefined8 *)((long)aVar3.m_pointer + 0x18));
        local_a0.m_hashValues[1] = extraout_var_01;
        dVar2 = *(double *)((long)aVar3.m_pointer + 400);
        iVar5 = *(int *)((long)local_a0.m_pointer + 0x160);
        *(int *)((long)local_a0.m_pointer + 0x160) = iVar5 + 1;
        *(float *)((long)local_a0.m_pointer + 0xf8) = (float)dVar2;
        dVar2 = *(double *)((long)aVar3.m_pointer + 0x1b0);
        *(int *)((long)local_a0.m_pointer + 0x160) = iVar5 + 2;
        *(float *)((long)local_a0.m_pointer + 0xfc) = (float)dVar2;
        local_98 = aVar3;
        cbtHashMap<cbtHashPtr,_cbtCollisionObject_*>::insert
                  (local_90,(cbtHashPtr *)&local_98,(cbtCollisionObject **)&local_a0.m_pointer);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < *(int *)(arrays + 0xe4));
  }
  if (0 < *(int *)(arrays + 0x104)) {
    lVar11 = 0;
    do {
      aVar3 = (anon_union_8_2_511b660c_for_cbtHashPtr_0)
              ((anon_union_8_2_511b660c_for_cbtHashPtr_0 *)(*(long *)(arrays + 0x110) + lVar11 * 8))
              ->m_pointer;
      local_88[0] = *(anon_union_8_2_511b660c_for_cbtHashPtr_0 *)((long)aVar3.m_pointer + 8);
      iVar5 = cbtHashMap<cbtHashPtr,_cbtCollisionShape_*>::findIndex(this_00,(cbtHashPtr *)local_88)
      ;
      ppcVar4 = (this->m_shapeMap).m_valueArray.m_data;
      if ((ppcVar4 == (cbtCollisionShape **)0x0 || iVar5 == -1) ||
         (ppcVar4[iVar5] == (cbtCollisionShape *)0x0)) {
        puts("error: no shape found");
      }
      else {
        pcVar7 = (char *)((long)aVar3.m_pointer + 0x20);
        pcVar1 = (char *)((long)aVar3.m_pointer + 0x5c);
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        lVar9 = 0;
        paVar8 = local_88;
        do {
          lVar10 = 0;
          do {
            paVar8->m_hashValues[lVar10] = *(uint *)(pcVar7 + lVar10 * 4);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          lVar9 = lVar9 + 1;
          paVar8 = paVar8 + 2;
          pcVar7 = pcVar7 + 0x10;
        } while (lVar9 != 3);
        lVar9 = 0xc;
        do {
          *(undefined4 *)((long)local_88 + lVar9 * 4) =
               *(undefined4 *)((long)aVar3.m_pointer + lVar9 * 4 + 0x20);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x10);
        local_a0._0_4_ =
             (*this->_vptr_cbtCollisionWorldImporter[3])
                       (this,local_88,ppcVar4[iVar5],*(undefined8 *)((long)aVar3.m_pointer + 0x18));
        local_a0.m_hashValues[1] = extraout_var_02;
        local_98 = aVar3;
        cbtHashMap<cbtHashPtr,_cbtCollisionObject_*>::insert
                  (local_90,(cbtHashPtr *)&local_98,(cbtCollisionObject **)&local_a0.m_pointer);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < *(int *)(arrays + 0x104));
  }
  return true;
}

Assistant:

bool cbtCollisionWorldImporter::convertAllObjects(cbtBulletSerializedArrays* arrays)
{
	m_shapeMap.clear();
	m_bodyMap.clear();

	int i;

	for (i = 0; i < arrays->m_bvhsDouble.size(); i++)
	{
		cbtOptimizedBvh* bvh = createOptimizedBvh();
		cbtQuantizedBvhDoubleData* bvhData = arrays->m_bvhsDouble[i];
		bvh->deSerializeDouble(*bvhData);
		m_bvhMap.insert(arrays->m_bvhsDouble[i], bvh);
	}
	for (i = 0; i < arrays->m_bvhsFloat.size(); i++)
	{
		cbtOptimizedBvh* bvh = createOptimizedBvh();
		cbtQuantizedBvhFloatData* bvhData = arrays->m_bvhsFloat[i];
		bvh->deSerializeFloat(*bvhData);
		m_bvhMap.insert(arrays->m_bvhsFloat[i], bvh);
	}

	for (i = 0; i < arrays->m_colShapeData.size(); i++)
	{
		cbtCollisionShapeData* shapeData = arrays->m_colShapeData[i];
		cbtCollisionShape* shape = convertCollisionShape(shapeData);
		if (shape)
		{
			//		printf("shapeMap.insert(%x,%x)\n",shapeData,shape);
			m_shapeMap.insert(shapeData, shape);
		}

		if (shape && shapeData->m_name)
		{
			char* newname = duplicateName(shapeData->m_name);
			m_objectNameMap.insert(shape, newname);
			m_nameShapeMap.insert(newname, shape);
		}
	}

	for (i = 0; i < arrays->m_collisionObjectDataDouble.size(); i++)
	{
		cbtCollisionObjectDoubleData* colObjData = arrays->m_collisionObjectDataDouble[i];
		cbtCollisionShape** shapePtr = m_shapeMap.find(colObjData->m_collisionShape);
		if (shapePtr && *shapePtr)
		{
			cbtTransform startTransform;
			colObjData->m_worldTransform.m_origin.m_floats[3] = 0.f;
			startTransform.deSerializeDouble(colObjData->m_worldTransform);

			cbtCollisionShape* shape = (cbtCollisionShape*)*shapePtr;
			cbtCollisionObject* body = createCollisionObject(startTransform, shape, colObjData->m_name);
			body->setFriction(cbtScalar(colObjData->m_friction));
			body->setRestitution(cbtScalar(colObjData->m_restitution));

#ifdef USE_INTERNAL_EDGE_UTILITY
			if (shape->getShapeType() == TRIANGLE_MESH_SHAPE_PROXYTYPE)
			{
				cbtBvhTriangleMeshShape* trimesh = (cbtBvhTriangleMeshShape*)shape;
				if (trimesh->getTriangleInfoMap())
				{
					body->setCollisionFlags(body->getCollisionFlags() | cbtCollisionObject::CF_CUSTOM_MATERIAL_CALLBACK);
				}
			}
#endif  //USE_INTERNAL_EDGE_UTILITY
			m_bodyMap.insert(colObjData, body);
		}
		else
		{
			printf("error: no shape found\n");
		}
	}
	for (i = 0; i < arrays->m_collisionObjectDataFloat.size(); i++)
	{
		cbtCollisionObjectFloatData* colObjData = arrays->m_collisionObjectDataFloat[i];
		cbtCollisionShape** shapePtr = m_shapeMap.find(colObjData->m_collisionShape);
		if (shapePtr && *shapePtr)
		{
			cbtTransform startTransform;
			colObjData->m_worldTransform.m_origin.m_floats[3] = 0.f;
			startTransform.deSerializeFloat(colObjData->m_worldTransform);

			cbtCollisionShape* shape = (cbtCollisionShape*)*shapePtr;
			cbtCollisionObject* body = createCollisionObject(startTransform, shape, colObjData->m_name);

#ifdef USE_INTERNAL_EDGE_UTILITY
			if (shape->getShapeType() == TRIANGLE_MESH_SHAPE_PROXYTYPE)
			{
				cbtBvhTriangleMeshShape* trimesh = (cbtBvhTriangleMeshShape*)shape;
				if (trimesh->getTriangleInfoMap())
				{
					body->setCollisionFlags(body->getCollisionFlags() | cbtCollisionObject::CF_CUSTOM_MATERIAL_CALLBACK);
				}
			}
#endif  //USE_INTERNAL_EDGE_UTILITY
			m_bodyMap.insert(colObjData, body);
		}
		else
		{
			printf("error: no shape found\n");
		}
	}

	return true;
}